

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall cmCTestBZR::LogParser::EndElement(LogParser *this,string *name)

{
  bool bVar1;
  reference pvVar2;
  string local_58;
  string local_38;
  string *local_18;
  string *name_local;
  LogParser *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"log");
  if (bVar1) {
    (*(this->BZR->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[8])
              (this->BZR,&this->Rev,&this->Changes);
  }
  else {
    bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
    if ((bVar1) ||
       ((bVar1 = std::operator==(local_18,"file"), !bVar1 &&
        (bVar1 = std::operator==(local_18,"directory"), !bVar1)))) {
      bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
      if ((bVar1) || (bVar1 = std::operator==(local_18,"symlink"), !bVar1)) {
        bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
        if ((bVar1) || (bVar1 = std::operator==(local_18,"committer"), !bVar1)) {
          bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
          if ((bVar1) || (bVar1 = std::operator==(local_18,"timestamp"), !bVar1)) {
            bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
            if ((bVar1) || (bVar1 = std::operator==(local_18,"message"), !bVar1)) {
              bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
              if ((!bVar1) && (bVar1 = std::operator==(local_18,"revno"), bVar1)) {
                pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
                std::vector<char,_std::allocator<char>_>::size(&this->CData);
                std::__cxx11::string::assign((char *)&this->Rev,(ulong)pvVar2);
              }
            }
            else {
              pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
              std::vector<char,_std::allocator<char>_>::size(&this->CData);
              std::__cxx11::string::assign((char *)&(this->Rev).Log,(ulong)pvVar2);
            }
          }
          else {
            pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
            std::vector<char,_std::allocator<char>_>::size(&this->CData);
            std::__cxx11::string::assign((char *)&(this->Rev).Date,(ulong)pvVar2);
          }
        }
        else {
          pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
          std::vector<char,_std::allocator<char>_>::size(&this->CData);
          std::__cxx11::string::assign((char *)&(this->Rev).Author,(ulong)pvVar2);
          bVar1 = cmsys::RegularExpression::find(&this->EmailRegex,&(this->Rev).Author);
          if (bVar1) {
            cmsys::RegularExpression::match_abi_cxx11_(&local_38,&this->EmailRegex,1);
            std::__cxx11::string::operator=((string *)&(this->Rev).Author,(string *)&local_38);
            std::__cxx11::string::~string((string *)&local_38);
            cmsys::RegularExpression::match_abi_cxx11_(&local_58,&this->EmailRegex,2);
            std::__cxx11::string::operator=((string *)&(this->Rev).EMail,(string *)&local_58);
            std::__cxx11::string::~string((string *)&local_58);
          }
        }
      }
      else {
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
        std::vector<char,_std::allocator<char>_>::size(&this->CData);
        std::__cxx11::string::assign((char *)&(this->CurChange).Path,(ulong)pvVar2);
        cmsys::SystemTools::ConvertToUnixSlashes(&(this->CurChange).Path);
        std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                  (&this->Changes,&this->CurChange);
      }
    }
    else {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
      std::vector<char,_std::allocator<char>_>::size(&this->CData);
      std::__cxx11::string::assign((char *)&(this->CurChange).Path,(ulong)pvVar2);
      cmsys::SystemTools::ConvertToUnixSlashes(&(this->CurChange).Path);
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                (&this->Changes,&this->CurChange);
    }
  }
  std::vector<char,_std::allocator<char>_>::clear(&this->CData);
  return;
}

Assistant:

virtual void EndElement(const std::string& name)
    {
    if(name == "log")
      {
      this->BZR->DoRevision(this->Rev, this->Changes);
      }
    else if(!this->CData.empty() &&
            (name == "file" || name == "directory"))
      {
      this->CurChange.Path.assign(&this->CData[0], this->CData.size());
      cmSystemTools::ConvertToUnixSlashes(this->CurChange.Path);
      this->Changes.push_back(this->CurChange);
      }
    else if(!this->CData.empty() && name == "symlink")
      {
      // symlinks have an arobase at the end in the log
      this->CurChange.Path.assign(&this->CData[0], this->CData.size()-1);
      cmSystemTools::ConvertToUnixSlashes(this->CurChange.Path);
      this->Changes.push_back(this->CurChange);
      }
    else if(!this->CData.empty() && name == "committer")
      {
      this->Rev.Author.assign(&this->CData[0], this->CData.size());
      if(this->EmailRegex.find(this->Rev.Author))
        {
        this->Rev.Author = this->EmailRegex.match(1);
        this->Rev.EMail = this->EmailRegex.match(2);
        }
      }
    else if(!this->CData.empty() && name == "timestamp")
      {
      this->Rev.Date.assign(&this->CData[0], this->CData.size());
      }
    else if(!this->CData.empty() && name == "message")
      {
      this->Rev.Log.assign(&this->CData[0], this->CData.size());
      }
    else if(!this->CData.empty() && name == "revno")
      {
      this->Rev.Rev.assign(&this->CData[0], this->CData.size());
      }
    this->CData.clear();
    }